

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O2

int Eso_ManComputeAnd(Eso_Man_t *p,Vec_Int_t *vCube1,Vec_Int_t *vCube2,Vec_Int_t *vCube)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  
  piVar7 = vCube->pArray;
  piVar6 = vCube1->pArray;
  piVar9 = vCube2->pArray;
  piVar1 = piVar6 + vCube1->nSize;
  piVar2 = piVar9 + vCube2->nSize;
  piVar8 = piVar7;
  while ((piVar6 < piVar1 && (piVar9 < piVar2))) {
    iVar3 = *piVar6;
    if (iVar3 == *piVar9) {
      piVar6 = piVar6 + 1;
      *piVar8 = iVar3;
      piVar9 = piVar9 + 1;
    }
    else {
      iVar3 = Abc_Lit2Var(iVar3);
      iVar4 = Abc_Lit2Var(*piVar9);
      if (iVar3 == iVar4) {
        return -1;
      }
      iVar3 = *piVar6;
      iVar4 = *piVar9;
      if (iVar3 < iVar4) {
        piVar6 = piVar6 + 1;
        *piVar8 = iVar3;
      }
      else {
        piVar9 = piVar9 + 1;
        *piVar8 = iVar4;
      }
    }
    piVar8 = piVar8 + 1;
    piVar7 = piVar7 + 1;
  }
  for (; piVar6 < piVar1; piVar6 = piVar6 + 1) {
    *piVar8 = *piVar6;
    piVar8 = piVar8 + 1;
    piVar7 = piVar7 + 1;
  }
  for (lVar5 = 0; (int *)((long)piVar9 + lVar5) < piVar2; lVar5 = lVar5 + 4) {
    *(int *)((long)piVar8 + lVar5) = *(int *)((long)piVar9 + lVar5);
    piVar7 = piVar7 + 1;
  }
  iVar3 = (int)((ulong)((long)piVar7 - (long)vCube->pArray) >> 2);
  vCube->nSize = iVar3;
  if (iVar3 <= vCube->nCap) {
    if (iVar3 < vCube1->nSize) {
      __assert_fail("vCube->nSize >= vCube1->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEsop.c"
                    ,0x195,
                    "int Eso_ManComputeAnd(Eso_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (vCube2->nSize <= iVar3) {
      iVar3 = Hsh_VecManAdd(p->pHash,vCube);
      return iVar3;
    }
    __assert_fail("vCube->nSize >= vCube2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEsop.c"
                  ,0x196,"int Eso_ManComputeAnd(Eso_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  __assert_fail("vCube->nSize <= vCube->nCap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEsop.c"
                ,0x194,"int Eso_ManComputeAnd(Eso_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Eso_ManComputeAnd( Eso_Man_t * p, Vec_Int_t * vCube1, Vec_Int_t * vCube2, Vec_Int_t * vCube )
{
    int * pBeg  = vCube->pArray;
    int * pBeg1 = vCube1->pArray;
    int * pBeg2 = vCube2->pArray;
    int * pEnd1 = vCube1->pArray + vCube1->nSize;
    int * pEnd2 = vCube2->pArray + vCube2->nSize;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( Abc_Lit2Var(*pBeg1) == Abc_Lit2Var(*pBeg2) )
            return -1;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    vCube->nSize = pBeg - vCube->pArray;
    assert( vCube->nSize <= vCube->nCap );
    assert( vCube->nSize >= vCube1->nSize );
    assert( vCube->nSize >= vCube2->nSize );
    return Hsh_VecManAdd( p->pHash, vCube );
}